

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

string * __thiscall
vkt::(anonymous_namespace)::clearColorToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkFormat vkFormat,
          VkClearColorValue value)

{
  bool *pbVar1;
  undefined4 in_register_00000014;
  int local_1c8;
  int local_1c4;
  int i_2;
  int i_1;
  int i;
  ostringstream local_1b0 [8];
  ostringstream stream;
  Vector<bool,_4> local_34;
  TextureChannelClass local_30;
  BVec4 channelMask;
  TextureChannelClass channelClass;
  TextureFormat format;
  VkFormat vkFormat_local;
  VkClearColorValue value_local;
  
  unique0x100000b4 = CONCAT44(in_register_00000014,vkFormat);
  format.order = (ChannelOrder)this;
  _channelMask = ::vk::mapVkFormat(format.order);
  local_30 = tcu::getTextureChannelClass(channelClass);
  tcu::getTextureFormatChannelMask((tcu *)&local_34,(TextureFormat *)&channelMask);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  std::operator<<((ostream *)local_1b0,"(");
  switch(local_30) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    for (local_1c8 = 0; local_1c8 < 4; local_1c8 = local_1c8 + 1) {
      if (0 < local_1c8) {
        std::operator<<((ostream *)local_1b0,", ");
      }
      pbVar1 = tcu::Vector<bool,_4>::operator[](&local_34,local_1c8);
      if ((*pbVar1 & 1U) == 0) {
        std::operator<<((ostream *)local_1b0,"Undef");
      }
      else {
        std::ostream::operator<<(local_1b0,(float)(&format.type)[local_1c8]);
      }
    }
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
      if (0 < i_2) {
        std::operator<<((ostream *)local_1b0,", ");
      }
      pbVar1 = tcu::Vector<bool,_4>::operator[](&local_34,i_2);
      if ((*pbVar1 & 1U) == 0) {
        std::operator<<((ostream *)local_1b0,"Undef");
      }
      else {
        std::ostream::operator<<(local_1b0,(&format.type)[i_2]);
      }
    }
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    for (local_1c4 = 0; local_1c4 < 4; local_1c4 = local_1c4 + 1) {
      if (0 < local_1c4) {
        std::operator<<((ostream *)local_1b0,", ");
      }
      pbVar1 = tcu::Vector<bool,_4>::operator[](&local_34,local_1c4);
      if ((*pbVar1 & 1U) == 0) {
        std::operator<<((ostream *)local_1b0,"Undef");
      }
      else {
        std::ostream::operator<<(local_1b0,(&format.type)[local_1c4]);
      }
    }
  }
  std::operator<<((ostream *)local_1b0,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string clearColorToString (VkFormat vkFormat, VkClearColorValue value)
{
	const tcu::TextureFormat		format			= mapVkFormat(vkFormat);
	const tcu::TextureChannelClass	channelClass	= tcu::getTextureChannelClass(format.type);
	const tcu::BVec4				channelMask		= tcu::getTextureFormatChannelMask(format);

	std::ostringstream				stream;

	stream << "(";

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			for (int i = 0; i < 4; i++)
			{
				if (i > 0)
					stream << ", ";

				if (channelMask[i])
					stream << value.int32[i];
				else
					stream << "Undef";
			}
			break;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			for (int i = 0; i < 4; i++)
			{
				if (i > 0)
					stream << ", ";

				if (channelMask[i])
					stream << value.uint32[i];
				else
					stream << "Undef";
			}
			break;

		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			for (int i = 0; i < 4; i++)
			{
				if (i > 0)
					stream << ", ";

				if (channelMask[i])
					stream << value.float32[i];
				else
					stream << "Undef";
			}
			break;

		default:
			DE_FATAL("Unknown channel class");
	}

	stream << ")";

	return stream.str();
}